

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitCallTarget(ParseNode *pnodeTarget,BOOL fSideEffectArgs,RegSlot *thisLocation,
                   bool *releaseThisLocation,RegSlot *callObjLocation,
                   ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                   ProfileId *callApplyCallSiteId)

{
  undefined1 *puVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  ProfileId PVar5;
  PropertyId PVar6;
  RegSlot RVar7;
  uint uVar8;
  RegSlot objReg;
  RegSlot RVar9;
  ParseNodeBin *pPVar10;
  undefined4 *puVar11;
  ParseNodeName *pPVar12;
  ParseNodeBin *pPVar13;
  ParseNodeSuperReference *pPVar14;
  ParseNodePtr this;
  
  *releaseThisLocation = true;
  OVar2 = pnodeTarget->nop;
  if (OVar2 == knopName) {
    pPVar12 = ParseNode::AsParseNodeName(pnodeTarget);
    if (pPVar12->isSpecialName == false) {
      FuncInfo::AcquireLoc(funcInfo,&pPVar12->super_ParseNode);
      if (fSideEffectArgs != 0) {
        SaveOpndValue(&pPVar12->super_ParseNode,funcInfo);
      }
      ByteCodeGenerator::EmitLoadInstance
                (byteCodeGenerator,pPVar12->sym,pPVar12->pid,thisLocation,callObjLocation,funcInfo);
      if (*callObjLocation != 0xffffffff) {
        PVar6 = ParseNodeName::PropertyIdFromNameNode(pPVar12);
        EmitMethodFld(&pPVar12->super_ParseNode,*callObjLocation,PVar6,byteCodeGenerator,funcInfo,
                      true);
        goto LAB_0076a7ab;
      }
    }
LAB_0076a6f9:
    Emit(pnodeTarget,byteCodeGenerator,funcInfo,0,false,false);
    RVar7 = funcInfo->undefinedConstantRegister;
    *thisLocation = RVar7;
  }
  else {
    if (OVar2 == knopIndex) {
      FuncInfo::AcquireLoc(funcInfo,pnodeTarget);
      if (fSideEffectArgs == 0) {
        pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
        uVar8 = ParseNode::Grfnop((uint)pPVar10->pnode2->nop);
        if ((uVar8 & 2) == 0) goto LAB_0076a588;
      }
      else {
LAB_0076a588:
        pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
        SaveOpndValue(pPVar10->pnode1,funcInfo);
      }
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      Emit(pPVar10->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      Emit(pPVar10->pnode2,byteCodeGenerator,funcInfo,0,false,false);
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      RVar7 = pPVar10->pnode2->location;
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      objReg = pPVar10->pnode1->location;
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      bVar4 = ByteCodeGenerator::IsSuper(pPVar10->pnode1);
      if (bVar4) {
        pPVar14 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
        Emit((ParseNode *)pPVar14->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
        objReg = ByteCodeGenerator::EmitLdObjProto(byteCodeGenerator,LdHomeObjProto,objReg,funcInfo)
        ;
        pPVar14 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
        FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar14->pnodeThis);
        pPVar14 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
        RVar9 = (pPVar14->pnodeThis->super_ParseNodeName).super_ParseNode.location;
        *releaseThisLocation = false;
      }
      else {
        pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
        RVar9 = pPVar10->pnode1->location;
      }
      *thisLocation = RVar9;
      EmitMethodElem(pnodeTarget,objReg,RVar7,byteCodeGenerator);
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnode2);
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      bVar4 = ByteCodeGenerator::IsSuper(pPVar10->pnode1);
      if (bVar4) {
        pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
        FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnode1);
      }
    }
    else {
      if (OVar2 != knopDot) goto LAB_0076a6f9;
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      FuncInfo::AcquireLoc(funcInfo,&pPVar10->super_ParseNode);
      if (fSideEffectArgs != 0) {
        SaveOpndValue(pPVar10->pnode1,funcInfo);
      }
      this = pPVar10->pnode2;
      if (this->nop != knopName) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1f89,"(pnodeBinTarget->pnode2->nop == knopName)",
                           "pnodeBinTarget->pnode2->nop == knopName");
        if (!bVar4) goto LAB_0076a810;
        *puVar11 = 0;
        this = pPVar10->pnode2;
      }
      pPVar12 = ParseNode::AsParseNodeName(this);
      PVar6 = ParseNodeName::PropertyIdFromNameNode(pPVar12);
      if (PVar6 == 0x4e) {
LAB_0076a43e:
        FuncInfo::EnsureCallSiteToCallApplyCallSiteMap(funcInfo);
        PVar5 = ByteCodeGenerator::GetNextCallApplyCallSiteId(byteCodeGenerator,CallI);
        *callApplyCallSiteId = PVar5;
        puVar1 = &pPVar10->pnode1->field_0x1;
        *puVar1 = *puVar1 | 8;
      }
      else {
        pPVar13 = ParseNode::AsParseNodeBin(pnodeTarget);
        pPVar12 = ParseNode::AsParseNodeName(pPVar13->pnode2);
        PVar6 = ParseNodeName::PropertyIdFromNameNode(pPVar12);
        if (PVar6 == 0x5a) goto LAB_0076a43e;
      }
      Emit(pPVar10->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      pPVar12 = ParseNode::AsParseNodeName(pPVar10->pnode2);
      PVar6 = ParseNodeName::PropertyIdFromNameNode(pPVar12);
      RVar7 = pPVar10->pnode1->location;
      bVar4 = ByteCodeGenerator::IsSuper(pPVar10->pnode1);
      if (bVar4) {
        pPVar14 = ParseNode::AsParseNodeSuperReference(&pPVar10->super_ParseNode);
        Emit((ParseNode *)pPVar14->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
        RVar7 = ByteCodeGenerator::EmitLdObjProto(byteCodeGenerator,LdHomeObjProto,RVar7,funcInfo);
        pPVar14 = ParseNode::AsParseNodeSuperReference(&pPVar10->super_ParseNode);
        FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar14->pnodeThis);
        FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnode1);
        pPVar14 = ParseNode::AsParseNodeSuperReference(&pPVar10->super_ParseNode);
        *thisLocation = (pPVar14->pnodeThis->super_ParseNodeName).super_ParseNode.location;
        *releaseThisLocation = false;
        uVar8 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,PVar6,false,false);
        Js::ByteCodeWriter::PatchablePropertyWithThisPtr
                  (&byteCodeGenerator->m_writer,LdSuperFld,pnodeTarget->location,RVar7,*thisLocation
                   ,uVar8,false,true);
      }
      else {
        *thisLocation = pPVar10->pnode1->location;
        EmitMethodFld(&pPVar10->super_ParseNode,RVar7,PVar6,byteCodeGenerator,funcInfo,true);
      }
    }
LAB_0076a7ab:
    RVar7 = *thisLocation;
  }
  if (RVar7 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1ffb,"(*thisLocation != Js::Constants::NoRegister)",
                       "*thisLocation != Js::Constants::NoRegister");
    if (!bVar4) {
LAB_0076a810:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
  }
  return;
}

Assistant:

void EmitCallTarget(
    ParseNode *pnodeTarget,
    BOOL fSideEffectArgs,
    Js::RegSlot *thisLocation,
    bool *releaseThisLocation,
    Js::RegSlot *callObjLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId * callApplyCallSiteId)
{
    // - emit target
    //    - assign this
    // - emit args
    // - do call

    // The call target is fully evaluated before the argument list. Note that we're not handling
    // put-call cases here currently, as such cases only apply to host objects
    // and are very unlikely to behave differently depending on the order of evaluation.

    *releaseThisLocation = true;

    switch (pnodeTarget->nop)
    {
    case knopDot:
    {
        ParseNodeBin * pnodeBinTarget = pnodeTarget->AsParseNodeBin();
        funcInfo->AcquireLoc(pnodeBinTarget);
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        if (fSideEffectArgs)
        {
            // Though we're done with target evaluation after this point, still protect opnd1 from
            // arg side-effects as it's the "this" pointer.
            SaveOpndValue(pnodeBinTarget->pnode1, funcInfo);
        }

        Assert(pnodeBinTarget->pnode2->nop == knopName);
        if ((pnodeBinTarget->pnode2->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::apply) || (pnodeTarget->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::call))
        {
            funcInfo->EnsureCallSiteToCallApplyCallSiteMap();
            
            *callApplyCallSiteId = byteCodeGenerator->GetNextCallApplyCallSiteId(Js::OpCode::CallI);
            pnodeBinTarget->pnode1->SetIsCallApplyTargetLoad();
        }

        Emit(pnodeBinTarget->pnode1, byteCodeGenerator, funcInfo, false);
        Js::PropertyId propertyId = pnodeBinTarget->pnode2->AsParseNodeName()->PropertyIdFromNameNode();
        Js::RegSlot protoLocation = pnodeBinTarget->pnode1->location;

        if (ByteCodeGenerator::IsSuper(pnodeBinTarget->pnode1))
        {
            Emit(pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            protoLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, protoLocation, funcInfo);
            funcInfo->ReleaseLoc(pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis);
            funcInfo->ReleaseLoc(pnodeBinTarget->pnode1);

            // Function calls on the 'super' object should maintain current 'this' pointer.
            *thisLocation = pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis->location;
            *releaseThisLocation = false;

            uint cacheId = funcInfo->FindOrAddInlineCacheId(protoLocation, propertyId, false, false);
            byteCodeGenerator->Writer()->PatchablePropertyWithThisPtr(Js::OpCode::LdSuperFld,
                pnodeTarget->location, protoLocation, *thisLocation, cacheId, false);
        }
        else
        {
            *thisLocation = pnodeBinTarget->pnode1->location;
            EmitMethodFld(pnodeBinTarget, protoLocation, propertyId, byteCodeGenerator, funcInfo);
        }

        break;
    }

    case knopIndex:
    {
        funcInfo->AcquireLoc(pnodeTarget);
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        if (fSideEffectArgs || !(ParseNode::Grfnop(pnodeTarget->AsParseNodeBin()->pnode2->nop) & fnopLeaf))
        {
            // Though we're done with target evaluation after this point, still protect opnd1 from
            // arg or opnd2 side-effects as it's the "this" pointer.
            SaveOpndValue(pnodeTarget->AsParseNodeBin()->pnode1, funcInfo);
        }
        Emit(pnodeTarget->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
        Emit(pnodeTarget->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo, false);

        Js::RegSlot indexLocation = pnodeTarget->AsParseNodeBin()->pnode2->location;
        Js::RegSlot protoLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;

        if (ByteCodeGenerator::IsSuper(pnodeTarget->AsParseNodeBin()->pnode1))
        {
            Emit(pnodeTarget->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            protoLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, protoLocation, funcInfo);
            funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeSuperReference()->pnodeThis);

            // Function calls on the 'super' object should maintain current 'this' pointer
            *thisLocation = pnodeTarget->AsParseNodeSuperReference()->pnodeThis->location;
            *releaseThisLocation = false;
        }
        else
        {
            *thisLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;
        }

        EmitMethodElem(pnodeTarget, protoLocation, indexLocation, byteCodeGenerator);

        funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeBin()->pnode2); // don't release indexLocation until after we use it.

        if (ByteCodeGenerator::IsSuper(pnodeTarget->AsParseNodeBin()->pnode1))
        {
            funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeBin()->pnode1);
        }
        break;
    }

    case knopName:
    {
        ParseNodeName * pnodeNameTarget = pnodeTarget->AsParseNodeName();
        if (!pnodeNameTarget->IsSpecialName())
        {
            funcInfo->AcquireLoc(pnodeNameTarget);
            // Assign the call target operand(s), putting them into expression temps if necessary to protect
            // them from side-effects.
            if (fSideEffectArgs)
            {
                SaveOpndValue(pnodeNameTarget, funcInfo);
            }
            byteCodeGenerator->EmitLoadInstance(pnodeNameTarget->sym, pnodeNameTarget->pid, thisLocation, callObjLocation, funcInfo);
            if (*callObjLocation != Js::Constants::NoRegister)
            {
                // Load the call target as a property of the instance.
                Js::PropertyId propertyId = pnodeNameTarget->PropertyIdFromNameNode();
                EmitMethodFld(pnodeNameTarget, *callObjLocation, propertyId, byteCodeGenerator, funcInfo);
                break;
            }
        }

        // FALL THROUGH to evaluate call target.
    }

    default:
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        Emit(pnodeTarget, byteCodeGenerator, funcInfo, false);
        *thisLocation = funcInfo->undefinedConstantRegister;
        break;
    }

    // "This" pointer should have been assigned by the above.
    Assert(*thisLocation != Js::Constants::NoRegister);
}